

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVariablesShaft.h
# Opt level: O1

void __thiscall chrono::ChVariablesShaft::ArchiveOUT(ChVariablesShaft *this,ChArchiveOut *marchive)

{
  ChArchiveOut::VersionWrite<chrono::ChVariablesShaft>(marchive);
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive);
  return;
}

Assistant:

virtual void ArchiveOUT(ChArchiveOut& marchive) override {
        // version number
        marchive.VersionWrite<ChVariablesShaft>();
        // serialize parent class
        ChVariables::ArchiveOUT(marchive);
        // serialize all member data:
        marchive << CHNVP(m_inertia);
    }